

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_audio_buffer_ref__data_source_on_get_data_format
                    (ma_data_source *pDataSource,ma_format *pFormat,ma_uint32 *pChannels,
                    ma_uint32 *pSampleRate,ma_channel *pChannelMap,size_t channelMapCap)

{
  *pFormat = *(ma_format *)((long)pDataSource + 0x48);
  *pChannels = *(ma_uint32 *)((long)pDataSource + 0x4c);
  *pSampleRate = *(ma_uint32 *)((long)pDataSource + 0x50);
  ma_channel_map_init_standard
            (ma_standard_channel_map_default,pChannelMap,channelMapCap,
             *(ma_uint32 *)((long)pDataSource + 0x4c));
  return MA_SUCCESS;
}

Assistant:

static ma_result ma_audio_buffer_ref__data_source_on_get_data_format(ma_data_source* pDataSource, ma_format* pFormat, ma_uint32* pChannels, ma_uint32* pSampleRate, ma_channel* pChannelMap, size_t channelMapCap)
{
    ma_audio_buffer_ref* pAudioBufferRef = (ma_audio_buffer_ref*)pDataSource;

    *pFormat     = pAudioBufferRef->format;
    *pChannels   = pAudioBufferRef->channels;
    *pSampleRate = pAudioBufferRef->sampleRate;
    ma_channel_map_init_standard(ma_standard_channel_map_default, pChannelMap, channelMapCap, pAudioBufferRef->channels);

    return MA_SUCCESS;
}